

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool __thiscall CConsole::LineIsValid(CConsole *this,char *pStr)

{
  char cVar1;
  long lVar2;
  int iVar3;
  CCommand *pCVar4;
  char *pcVar5;
  bool bVar6;
  CResult *this_00;
  CConsole *this_01;
  char *pcVar7;
  long in_FS_OFFSET;
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pStr == (char *)0x0) {
LAB_00123d21:
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if ((*pStr != '\0') && (*pStr != '#')) {
LAB_00123c7e:
      this_00 = &Result;
      CResult::CResult(&Result);
      pcVar7 = (char *)0x0;
      pcVar5 = pStr;
      do {
        cVar1 = *pcVar5;
        if (cVar1 == '\"') {
          pcVar7 = (char *)(ulong)((uint)pcVar7 ^ 1);
        }
        else if (cVar1 == '\\') {
          if (pcVar5[1] == '\"') {
            pcVar5 = pcVar5 + 1;
          }
        }
        else {
          if (cVar1 == '\0') {
            pcVar7 = (char *)0x0;
            goto LAB_00123cd3;
          }
          if ((uint)pcVar7 == 0) {
            pcVar7 = (char *)0x0;
            if (cVar1 == '#') goto LAB_00123cd3;
            if (cVar1 == ';') goto LAB_00123ccf;
          }
          else {
            pcVar7 = (char *)0x1;
          }
        }
        pcVar5 = pcVar5 + 1;
      } while( true );
    }
  }
LAB_00123d23:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar6;
LAB_00123ccf:
  pcVar7 = pcVar5 + 1;
LAB_00123cd3:
  ParseStart((CConsole *)this_00,&Result,pStr,((int)pcVar5 - (int)pStr) + 1);
  this_01 = this;
  pCVar4 = FindCommand(this,Result.m_pCommand,this->m_FlagMask);
  if ((pCVar4 == (CCommand *)0x0) ||
     (iVar3 = ParseArgs(this_01,&Result,(pCVar4->super_CCommandInfo).m_pParams), iVar3 != 0))
  goto LAB_00123d21;
  if ((pcVar7 == (char *)0x0) || (pStr = pcVar7, *pcVar7 == '\0')) goto LAB_00123d23;
  goto LAB_00123c7e;
}

Assistant:

bool CConsole::LineIsValid(const char *pStr)
{
	if(!pStr)
		return false;

	// Comments and empty lines are valid commands
	if(*pStr == '#' || *pStr == '\0')
		return true;

	do
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return false;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);
		if(!pCommand || ParseArgs(&Result, pCommand->m_pParams))
			return false;

		pStr = pNextPart;
	}
	while(pStr && *pStr);

	return true;
}